

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrCreateSceneMSFT
                   (XrSceneObserverMSFT sceneObserver,XrSceneCreateInfoMSFT *createInfo,
                   XrSceneMSFT *scene)

{
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar1;
  ValidateXrHandleResult VVar2;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar4;
  allocator local_3e9;
  string local_3e8 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_3c8;
  allocator local_3a9;
  string local_3a8 [39];
  allocator local_381;
  string local_380 [39];
  allocator local_359;
  string local_358 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_338;
  allocator local_319;
  string local_318 [39];
  allocator local_2f1;
  string local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [32];
  GenValidUsageXrInstanceInfo *local_2a8;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_sceneobservermsft_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  string local_280 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_260;
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [32];
  XrSceneObserverMSFT_T local_1f8 [32];
  ostringstream local_1d8 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrObjectType local_4c;
  undefined1 local_48 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrResult xr_result;
  XrSceneMSFT *scene_local;
  XrSceneCreateInfoMSFT *createInfo_local;
  XrSceneObserverMSFT sceneObserver_local;
  GenValidUsageXrInstanceInfo *pGVar3;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  createInfo_local = (XrSceneCreateInfoMSFT *)sceneObserver;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_48);
  local_4c = XR_OBJECT_TYPE_SCENE_OBSERVER_MSFT;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSceneObserverMSFT_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)local_48
             ,(XrSceneObserverMSFT_T **)&createInfo_local,&local_4c);
  VVar2 = VerifyXrSceneObserverMSFTHandle((XrSceneObserverMSFT *)&createInfo_local);
  if (VVar2 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar4 = HandleInfo<XrSceneObserverMSFT_T_*>::getWithInstanceInfo
                      (&g_sceneobservermsft_info,(XrSceneObserverMSFT_T *)createInfo_local);
    pGVar3 = pVar4.second;
    gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar4.first;
    pVar1 = pVar4;
    if (createInfo != (XrSceneCreateInfoMSFT *)0x0) {
      local_2a8 = pGVar3;
      gen_sceneobservermsft_info = (GenValidUsageXrHandleInfo *)gen_instance_info;
      info_with_instance.first = (GenValidUsageXrHandleInfo *)pGVar3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2c8,"xrCreateSceneMSFT",&local_2c9);
      objects_info.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           ValidateXrStruct(pGVar3,(string *)local_2c8,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)local_48,false,true,createInfo);
      std::__cxx11::string::~string(local_2c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
      pGVar3 = local_2a8;
      pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
      pVar1.first = gen_sceneobservermsft_info;
      pVar4.second = local_2a8;
      pVar4.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
      if (objects_info.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != XR_SUCCESS) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_2f0,"VUID-xrCreateSceneMSFT-createInfo-parameter",&local_2f1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_318,"xrCreateSceneMSFT",&local_319);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_338,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_48);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_358,"Command xrCreateSceneMSFT param createInfo is invalid",&local_359);
        CoreValidLogMessage(pGVar3,(string *)local_2f0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            (string *)local_318,&local_338,(string *)local_358);
        std::__cxx11::string::~string(local_358);
        std::allocator<char>::~allocator((allocator<char> *)&local_359);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_338);
        std::__cxx11::string::~string(local_318);
        std::allocator<char>::~allocator((allocator<char> *)&local_319);
        std::__cxx11::string::~string(local_2f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
        pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
        pVar1.first = gen_sceneobservermsft_info;
        pVar4.second = local_2a8;
        pVar4.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
        sceneObserver_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        info_with_instance.second._4_4_ = 1;
        goto LAB_002bcbfb;
      }
    }
    info_with_instance.first = (GenValidUsageXrHandleInfo *)pVar1.second;
    gen_sceneobservermsft_info = pVar1.first;
    local_2a8 = pVar4.second;
    pGVar3 = local_2a8;
    gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar4.first;
    if (scene == (XrSceneMSFT *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_380,"VUID-xrCreateSceneMSFT-scene-parameter",&local_381);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3a8,"xrCreateSceneMSFT",&local_3a9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_3c8,
                 (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 local_48);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3e8,
                 "Invalid NULL for XrSceneMSFT \"scene\" which is not optional and must be non-NULL"
                 ,&local_3e9);
      CoreValidLogMessage(pGVar3,(string *)local_380,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          (string *)local_3a8,&local_3c8,(string *)local_3e8);
      std::__cxx11::string::~string(local_3e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_3c8);
      std::__cxx11::string::~string(local_3a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
      std::__cxx11::string::~string(local_380);
      std::allocator<char>::~allocator((allocator<char> *)&local_381);
      pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
      pVar1.first = gen_sceneobservermsft_info;
      pVar4.second = local_2a8;
      pVar4.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
      sceneObserver_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      info_with_instance.second._4_4_ = 1;
    }
    else {
      sceneObserver_local._4_4_ =
           objects_info.
           super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      info_with_instance.second._4_4_ = 1;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1d8);
    std::operator<<((ostream *)local_1d8,"Invalid XrSceneObserverMSFT handle \"sceneObserver\" ");
    HandleToHexString<XrSceneObserverMSFT_T*>(local_1f8);
    std::operator<<((ostream *)local_1d8,(string *)local_1f8);
    std::__cxx11::string::~string((string *)local_1f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_218,"VUID-xrCreateSceneMSFT-sceneObserver-parameter",&local_219);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_240,"xrCreateSceneMSFT",&local_241);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_260,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_48);
    std::__cxx11::ostringstream::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_218,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_240,&local_260,local_280);
    std::__cxx11::string::~string((string *)local_280);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_260);
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    std::__cxx11::string::~string(local_218);
    std::allocator<char>::~allocator((allocator<char> *)&local_219);
    sceneObserver_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    info_with_instance.second._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1d8);
    pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
    pVar1.first = gen_sceneobservermsft_info;
    pVar4.second = local_2a8;
    pVar4.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
  }
LAB_002bcbfb:
  info_with_instance.first = (GenValidUsageXrHandleInfo *)pVar1.second;
  gen_sceneobservermsft_info = pVar1.first;
  local_2a8 = pVar4.second;
  gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar4.first;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_48);
  return sceneObserver_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrCreateSceneMSFT(
XrSceneObserverMSFT sceneObserver,
const XrSceneCreateInfoMSFT* createInfo,
XrSceneMSFT* scene) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(sceneObserver, XR_OBJECT_TYPE_SCENE_OBSERVER_MSFT);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSceneObserverMSFTHandle(&sceneObserver);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSceneObserverMSFT handle \"sceneObserver\" ";
                oss << HandleToHexString(sceneObserver);
                CoreValidLogMessage(nullptr, "VUID-xrCreateSceneMSFT-sceneObserver-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrCreateSceneMSFT",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_sceneobservermsft_info.getWithInstanceInfo(sceneObserver);
        GenValidUsageXrHandleInfo *gen_sceneobservermsft_info = info_with_instance.first;
        (void)gen_sceneobservermsft_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Validate that the structure XrSceneCreateInfoMSFT is valid
        if (nullptr != createInfo) {
            xr_result = ValidateXrStruct(gen_instance_info, "xrCreateSceneMSFT",
                                                            objects_info, false, true, createInfo);
            if (XR_SUCCESS != xr_result) {
                CoreValidLogMessage(gen_instance_info, "VUID-xrCreateSceneMSFT-createInfo-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrCreateSceneMSFT",
                                    objects_info,
                                    "Command xrCreateSceneMSFT param createInfo is invalid");
                return xr_result;
            }
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == scene) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrCreateSceneMSFT-scene-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrCreateSceneMSFT", objects_info,
                                "Invalid NULL for XrSceneMSFT \"scene\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}